

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTport.c
# Opt level: O3

void sbfTport_destroy(sbfTport tport)

{
  sbfMutex *__mutex;
  sbfMwThread psVar1;
  undefined8 *puVar2;
  u_int uVar3;
  sbfTportStreamImpl *psVar4;
  
  sbfLog_log(tport->mLog,0,"destroying transport %p",tport);
  __mutex = &tport->mStreamsLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  psVar4 = (tport->mStreams).tqh_first;
  if (psVar4 == (sbfTportStreamImpl *)0x0) {
    uVar3 = tport->mStreamsWaiting;
  }
  else {
    do {
      puVar2 = (undefined8 *)sbfMemory_malloc(0x98);
      *puVar2 = tport;
      puVar2[1] = psVar4;
      psVar1 = psVar4->mThread;
      puVar2[2] = psVar1;
      sbfMw_enqueueThread(psVar1,puVar2 + 3,sbfTportFirstDestroyStreamCb,puVar2);
      uVar3 = tport->mStreamsWaiting + 1;
      tport->mStreamsWaiting = uVar3;
      psVar4 = (psVar4->mEntry).tqe_next;
    } while (psVar4 != (sbfTportStreamImpl *)0x0);
  }
  if (uVar3 != 0) {
    do {
      sbfLog_log(tport->mLog,0,"transport %p waiting for %u streams",tport);
      pthread_cond_wait((pthread_cond_t *)&tport->mStreamsCondVar,(pthread_mutex_t *)__mutex);
    } while (tport->mStreamsWaiting != 0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  (*tport->mHandlerTable->mDestroy)(tport->mHandler);
  sbfLog_log(tport->mLog,0,"freeing transport %p",tport);
  sbfTportFree(tport);
  return;
}

Assistant:

void
sbfTport_destroy (sbfTport tport)
{
    sbfTportStream                tstream;
    sbfTportDestroyStreamClosure* closure0;

    sbfLog_debug (tport->mLog, "destroying transport %p", tport);

    sbfMutex_lock (&tport->mStreamsLock);
    TAILQ_FOREACH (tstream, &tport->mStreams, mEntry)
    {
        closure0 = xmalloc (sizeof *closure0);
        closure0->mTport = tport;
        closure0->mTportStream = tstream;

        closure0->mThread = tstream->mThread;
        sbfMw_enqueueThread (closure0->mThread,
                             &closure0->mEvent,
                             sbfTportFirstDestroyStreamCb,
                             closure0);

        tport->mStreamsWaiting++;
    }
    while (tport->mStreamsWaiting != 0)
    {
        sbfLog_debug (tport->mLog,
                      "transport %p waiting for %u streams",
                      tport,
                      tport->mStreamsWaiting);
        sbfCondVar_wait (&tport->mStreamsCondVar, &tport->mStreamsLock);
    }
    sbfMutex_unlock (&tport->mStreamsLock);

    tport->mHandlerTable->mDestroy (tport->mHandler);

    sbfLog_debug (tport->mLog, "freeing transport %p", tport);
    sbfTportFree (tport);
}